

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace14.c
# Opt level: O1

void lace_stop(void)

{
  worker_data **ppwVar1;
  ulong uVar2;
  ulong uVar3;
  
  lace_resume();
  do {
  } while (workers_running != n_workers);
  LOCK();
  lace_quits = 1;
  UNLOCK();
  do {
  } while (workers_running != 0);
  do {
  } while (lace_bar.leaving != 0);
  sem_destroy((sem_t *)&suspend_semaphore);
  ppwVar1 = workers_memory;
  uVar2 = (ulong)n_workers;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      free(ppwVar1[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  free(workers);
  free(workers_p);
  free(workers_memory);
  workers = (Worker **)0x0;
  workers_p = (WorkerP **)0x0;
  workers_memory = (worker_data **)0x0;
  return;
}

Assistant:

void lace_stop()
{
    // Workers need to be awake for this
    lace_resume();

    // Do not stop if not all workers are running yet
    while (workers_running != n_workers) {}

    lace_quits = 1;

    while (workers_running != 0) {}

#if LACE_COUNT_EVENTS
    lace_count_report_file(stdout);
#endif

    // finally, destroy the barriers
    lace_barrier_destroy();
    sem_destroy(&suspend_semaphore);

    for (unsigned int i=0; i<n_workers; i++) {
#if LACE_USE_MMAP
        munmap(workers_memory[i], workers_memory_size);
#elif defined(_MSC_VER) || defined(__MINGW64_VERSION_MAJOR)
	_aligned_free(workers_memory[i]);
#elif defined(__MINGW32__)
	__mingw_aligned_free(workers_memory[i]);
#else
        free(workers_memory[i]);
#endif
    }

#if defined(_MSC_VER) || defined(__MINGW64_VERSION_MAJOR)
    _aligned_free(workers);
    _aligned_free(workers_p);
    _aligned_free(workers_memory);
#elif defined(__MINGW32__)
    __mingw_aligned_free(workers);
    __mingw_aligned_free(workers_p);
    __mingw_aligned_free(workers_memory);
#else
    free(workers);
    free(workers_p);
    free(workers_memory);
#endif

    workers = 0;
    workers_p = 0;
    workers_memory = 0;
}